

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool __thiscall libwebm::BCMVHeader::Write(BCMVHeader *this,PacketDataBuffer *buffer)

{
  uint32_t uVar1;
  size_t sVar2;
  uint8_t local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  int iStack_30;
  uint8_t bcmv_buffer [6];
  uint32_t bcmv_total_length;
  int kRemainingBytes;
  int i;
  int kBcmvSize;
  PacketDataBuffer *buffer_local;
  BCMVHeader *this_local;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    fprintf(_stderr,"Webm2Pes: nullptr for buffer in BCMV Write.\n");
    this_local._7_1_ = false;
  }
  else {
    for (bcmv_total_length = 0; (int)bcmv_total_length < 4;
        bcmv_total_length = bcmv_total_length + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (buffer,this->bcmv + (int)bcmv_total_length);
    }
    bcmv_buffer[2] = '\x06';
    bcmv_buffer[3] = '\0';
    bcmv_buffer[4] = '\0';
    bcmv_buffer[5] = '\0';
    uVar1 = this->length;
    sVar2 = size();
    iStack_30 = uVar1 + (int)sVar2;
    local_36 = (uint8_t)((uint)iStack_30 >> 0x18);
    local_35 = (undefined1)((uint)iStack_30 >> 0x10);
    local_34 = (undefined1)((uint)iStack_30 >> 8);
    local_33 = (undefined1)iStack_30;
    local_32 = 0;
    local_31 = 0;
    this_local._7_1_ = CopyAndEscapeStartCodes(&local_36,6,buffer);
  }
  return this_local._7_1_;
}

Assistant:

bool BCMVHeader::Write(PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr for buffer in BCMV Write.\n");
    return false;
  }
  const int kBcmvSize = 4;
  for (int i = 0; i < kBcmvSize; ++i)
    buffer->push_back(bcmv[i]);

  // Note: The 4 byte length field must include the size of the BCMV header.
  const int kRemainingBytes = 6;
  const uint32_t bcmv_total_length = length + static_cast<uint32_t>(size());
  const uint8_t bcmv_buffer[kRemainingBytes] = {
      static_cast<std::uint8_t>((bcmv_total_length >> 24) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 16) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 8) & 0xff),
      static_cast<std::uint8_t>(bcmv_total_length & 0xff),
      0,
      0 /* 2 bytes 0 padding */};

  return CopyAndEscapeStartCodes(bcmv_buffer, kRemainingBytes, buffer);
}